

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O0

bool __thiscall AActor::HasSpecialDeathStates(AActor *this)

{
  FStateLabels *this_00;
  FStateLabel *pFVar1;
  int local_30;
  FName local_2c;
  int i;
  FStateLabel *slabel;
  PClassActor *info;
  AActor *this_local;
  
  info = (PClassActor *)this;
  slabel = (FStateLabel *)GetClass(this);
  if (((MetaClass *)slabel)->StateList != (FStateLabels *)0x0) {
    this_00 = ((MetaClass *)slabel)->StateList;
    FName::FName(&local_2c,NAME_Death);
    pFVar1 = FStateLabels::FindLabel(this_00,&local_2c);
    if ((pFVar1 != (FStateLabel *)0x0) && (pFVar1->Children != (FStateLabels *)0x0)) {
      for (local_30 = 0; local_30 < pFVar1->Children->NumLabels; local_30 = local_30 + 1) {
        if (pFVar1->Children->Labels[local_30].State != (FState *)0x0) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool AActor::HasSpecialDeathStates () const
{
	const PClassActor *info = static_cast<PClassActor *>(GetClass());

	if (info->StateList != NULL)
	{
		FStateLabel *slabel = info->StateList->FindLabel (NAME_Death);
		if (slabel != NULL && slabel->Children != NULL)
		{
			for(int i = 0; i < slabel->Children->NumLabels; i++)
			{
				if (slabel->Children->Labels[i].State != NULL)
				{
					return true;
				}
			}
		}
	}
	return false;
}